

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O3

tensor * ad(tensor *a,tensor *b)

{
  add *this;
  tensor *ptVar1;
  initializer_list<tensor_*> __l;
  allocator_type local_41;
  vector<tensor_*,_std::allocator<tensor_*>_> local_40;
  tensor *local_28;
  tensor *local_20;
  
  this = (add *)operator_new(0x48);
  (this->super_node)._vptr_node = (_func_int **)0x0;
  (this->super_node).ret = (tensor *)0x0;
  (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->super_node).isbuild = 0;
  node::node_cnt = node::node_cnt + 1;
  (this->super_node)._vptr_node = (_func_int **)&PTR_forward_0010a928;
  __l._M_len = 2;
  __l._M_array = &local_28;
  local_28 = a;
  local_20 = b;
  std::vector<tensor_*,_std::allocator<tensor_*>_>::vector(&local_40,__l,&local_41);
  ptVar1 = add::forward(this,&local_40);
  if (local_40.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return ptVar1;
}

Assistant:

tensor* ad(tensor *a, tensor *b){
    node *op=new add();
    return op->forward({a,b});
}